

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_binary.cpp
# Opt level: O2

string * flatbuffers::anon_unknown_5::BinaryFileName
                   (string *__return_storage_ptr__,Parser *parser,string *path,string *file_name)

{
  string ext;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((parser->file_extension_)._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"bin",(allocator<char> *)&bStack_78);
  }
  else {
    std::__cxx11::string::string((string *)&local_58,(string *)&parser->file_extension_);
  }
  std::operator+(&local_38,path,file_name);
  std::operator+(&bStack_78,&local_38,".");
  std::operator+(__return_storage_ptr__,&bStack_78,&local_58);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

static std::string BinaryFileName(const Parser &parser, const std::string &path,
                                  const std::string &file_name) {
  auto ext = parser.file_extension_.length() ? parser.file_extension_ : "bin";
  return path + file_name + "." + ext;
}